

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeT2LoadT(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  uint64_t Address_00;
  uint64_t Address_01;
  uint uVar4;
  
  uVar4 = Insn >> 0x10 & 0xf;
  if (uVar4 != 0xf) {
    DVar1 = DecoderGPRRegisterClass(Inst,Insn >> 0xc & 0xf,Address,Decoder);
    DVar3 = MCDisassembler_Fail;
    if (((((DVar1 | 2) == MCDisassembler_Success) &&
         (DVar2 = DecodeT2AddrModeImm8
                            (Inst,uVar4 << 9 | Insn & 0xff,Address_00,(void *)(ulong)(DVar1 | 2)),
         DVar3 = DVar2, DVar2 != MCDisassembler_Fail)) &&
        (DVar3 = DVar1, DVar2 != MCDisassembler_Success)) &&
       (DVar3 = DVar2, DVar2 != MCDisassembler_SoftFail)) {
      DVar3 = MCDisassembler_Fail;
    }
    return DVar3;
  }
  uVar4 = MCInst_getOpcode(Inst);
  if (uVar4 == 0x969) {
    uVar4 = 0x96e;
  }
  else {
    Decoder = (void *)(ulong)uVar4;
    if (uVar4 == 0x951) {
      uVar4 = 0x956;
    }
    else if (uVar4 == 0x959) {
      uVar4 = 0x95e;
    }
    else if (uVar4 == 0x961) {
      uVar4 = 0x966;
    }
    else {
      if (uVar4 != 0x942) {
        return MCDisassembler_Fail;
      }
      uVar4 = 0x947;
    }
  }
  MCInst_setOpcode(Inst,uVar4);
  DVar3 = DecodeT2LoadLabel(Inst,Insn,Address_01,Decoder);
  return DVar3;
}

Assistant:

static DecodeStatus DecodeT2LoadT(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 8);
	imm |= (Rn << 9);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRT:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRBT:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRHT:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSBT:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRSHT:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeT2AddrModeImm8(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}